

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O0

void __thiscall
cmDebugServerJson::ProcessRequest
          (cmDebugServerJson *this,cmConnection *connection,string *jsonRequest)

{
  pointer *this_00;
  cmDebugger *pcVar1;
  bool bVar2;
  __type _Var3;
  Int IVar4;
  Value *pVVar5;
  long lVar6;
  size_type __n;
  reference __x;
  ulong uVar7;
  char *pcVar8;
  cmMakefile *pcVar9;
  string local_430;
  Value local_410;
  string local_3e8;
  Value local_3c8;
  allocator local_399;
  string local_398;
  Value local_378;
  Value local_350;
  char *local_328;
  char *v;
  string requestVal;
  Value local_2e0;
  undefined1 local_2b8 [8];
  cmPauseContext ctx;
  unsigned_long *w_id;
  iterator __end7_1;
  iterator __begin7_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range7_1;
  cmWatchpoint *watchpoint;
  iterator __end7;
  iterator __begin7;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *__range7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> removeList;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> watchpoints;
  string expr;
  uint local_1ec;
  undefined1 local_1e8 [4];
  WatchpointType watchpointType;
  string type;
  string local_1a8;
  undefined1 local_188 [8];
  string request;
  undefined1 local_158 [8];
  Value value;
  Reader reader;
  string *jsonRequest_local;
  cmConnection *connection_local;
  cmDebugServerJson *this_local;
  
  Json::Reader::Reader((Reader *)&value.limit_);
  Json::Value::Value((Value *)local_158,nullValue);
  bVar2 = Json::Reader::parse((Reader *)&value.limit_,jsonRequest,(Value *)local_158,true);
  if (!bVar2) {
    request.field_2._8_4_ = 1;
    goto LAB_0086d021;
  }
  pVVar5 = Json::Value::operator[]((Value *)local_158,"Command");
  Json::Value::asString_abi_cxx11_((string *)local_188,pVVar5);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_188,"Break");
  if (bVar2) {
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x15])();
LAB_0086d00b:
    request.field_2._8_4_ = 0;
  }
  else {
    lVar6 = std::__cxx11::string::find(local_188,0xa49b26);
    if (lVar6 == 0) {
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x11])();
      goto LAB_0086d00b;
    }
    lVar6 = std::__cxx11::string::find(local_188,0xa49b37);
    if (lVar6 == 0) {
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      pVVar5 = Json::Value::operator[]((Value *)local_158,"File");
      Json::Value::asString_abi_cxx11_(&local_1a8,pVVar5);
      pVVar5 = Json::Value::operator[]((Value *)local_158,"Line");
      IVar4 = Json::Value::asInt(pVVar5);
      (*pcVar1->_vptr_cmDebugger[0x10])(pcVar1,&local_1a8,(long)IVar4);
      std::__cxx11::string::~string((string *)&local_1a8);
      goto LAB_0086d00b;
    }
    lVar6 = std::__cxx11::string::find(local_188,0xa49b4d);
    if (lVar6 == 0) {
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      pVVar5 = Json::Value::operator[]((Value *)local_158,"File");
      Json::Value::asString_abi_cxx11_((string *)((long)&type.field_2 + 8),pVVar5);
      pVVar5 = Json::Value::operator[]((Value *)local_158,"Line");
      IVar4 = Json::Value::asInt(pVVar5);
      (*pcVar1->_vptr_cmDebugger[0xe])(pcVar1,(undefined1 *)((long)&type.field_2 + 8),(long)IVar4);
      std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
      goto LAB_0086d00b;
    }
    lVar6 = std::__cxx11::string::find(local_188,0xa49b5b);
    if (lVar6 == 0) {
      pVVar5 = Json::Value::operator[]((Value *)local_158,"Type");
      Json::Value::asString_abi_cxx11_((string *)local_1e8,pVVar5);
      local_1ec = 2;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1e8,"Read");
      if (bVar2) {
        local_1ec = 4;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1e8,"All");
        if (bVar2) {
          local_1ec = 0xf;
        }
      }
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      pVVar5 = Json::Value::operator[]((Value *)local_158,"Expr");
      Json::Value::asString_abi_cxx11_((string *)((long)&expr.field_2 + 8),pVVar5);
      (*pcVar1->_vptr_cmDebugger[0x12])
                (pcVar1,(undefined1 *)((long)&expr.field_2 + 8),(ulong)local_1ec);
      std::__cxx11::string::~string((string *)(expr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1e8);
      goto LAB_0086d00b;
    }
    lVar6 = std::__cxx11::string::find(local_188,0xa49b77);
    if (lVar6 == 0) {
      pVVar5 = Json::Value::operator[]((Value *)local_158,"Expr");
      Json::Value::asString_abi_cxx11_
                ((string *)
                 &watchpoints.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,pVVar5);
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[8])
                (&removeList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range7);
      __n = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::size
                      ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)
                       &removeList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range7,__n);
      this_00 = &removeList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end7 = std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::begin
                         ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)this_00);
      watchpoint = (cmWatchpoint *)
                   std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::end
                             ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end7,(__normal_iterator<cmWatchpoint_*,_std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>_>
                                         *)&watchpoint), bVar2) {
        __x = __gnu_cxx::
              __normal_iterator<cmWatchpoint_*,_std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>_>
              ::operator*(&__end7);
        _Var3 = std::operator==(&__x->Variable,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&watchpoints.
                                  super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (_Var3) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range7,&__x->Id);
        }
        __gnu_cxx::
        __normal_iterator<cmWatchpoint_*,_std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>_>
        ::operator++(&__end7);
      }
      __end7_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range7);
      w_id = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range7);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end7_1,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)&w_id), bVar2) {
        ctx.Lock._8_8_ =
             __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end7_1);
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        (*pcVar1->_vptr_cmDebugger[0x13])(pcVar1,*(unsigned_long *)ctx.Lock._8_8_);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end7_1);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range7);
      std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector
                ((vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> *)
                 &removeList.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &watchpoints.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      goto LAB_0086d00b;
    }
    lVar6 = std::__cxx11::string::find(local_188,0xa49b88);
    if (lVar6 == 0) {
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x14])();
      goto LAB_0086d00b;
    }
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
              (local_2b8);
    bVar2 = cmPauseContext::operator_cast_to_bool((cmPauseContext *)local_2b8);
    if (bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_188,"Continue");
      if (bVar2) {
        cmPauseContext::Continue((cmPauseContext *)local_2b8);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_188,"StepIn");
        if (bVar2) {
          cmPauseContext::StepIn((cmPauseContext *)local_2b8);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_188,"StepOut");
          if (bVar2) {
            cmPauseContext::StepOut((cmPauseContext *)local_2b8);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_188,"StepOver");
            if (bVar2) {
              cmPauseContext::Step((cmPauseContext *)local_2b8);
            }
            else {
              lVar6 = std::__cxx11::string::find(local_188,0xa49bdf);
              if (lVar6 != 0) {
                Json::Value::Value(&local_410,"Improper command for paused context");
                pVVar5 = Json::Value::operator[]((Value *)local_158,"Error");
                Json::Value::operator=(pVVar5,&local_410);
                Json::Value::~Value(&local_410);
                Json::Value::toStyledString_abi_cxx11_(&local_430,(Value *)local_158);
                (**connection->_vptr_cmConnection)(connection,&local_430);
                std::__cxx11::string::~string((string *)&local_430);
                request.field_2._8_4_ = 1;
                goto LAB_0086cfd7;
              }
              pVVar5 = Json::Value::operator[]((Value *)local_158,"Request");
              Json::Value::asString_abi_cxx11_((string *)&v,pVVar5);
              local_328 = (char *)0x0;
              uVar7 = std::__cxx11::string::empty();
              if ((((uVar7 & 1) == 0) &&
                  (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&v), *pcVar8 == '\"'))
                 && (pcVar8 = (char *)std::__cxx11::string::back(), *pcVar8 == '\"')) {
                pcVar9 = cmPauseContext::GetMakefile((cmPauseContext *)local_2b8);
                local_328 = cmMakefile::ExpandVariablesInString(pcVar9,(string *)&v);
              }
              else {
                pcVar9 = cmPauseContext::GetMakefile((cmPauseContext *)local_2b8);
                local_328 = cmMakefile::GetDefinition(pcVar9,(string *)&v);
              }
              Json::Value::removeMember(&local_350,(Value *)local_158,"Command");
              Json::Value::~Value(&local_350);
              pcVar8 = local_328;
              if (local_328 == (char *)0x0) {
                Json::Value::Value(&local_3c8,false);
                pVVar5 = Json::Value::operator[]((Value *)local_158,"Response");
                Json::Value::operator=(pVVar5,&local_3c8);
                Json::Value::~Value(&local_3c8);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_398,pcVar8,&local_399);
                Json::Value::Value(&local_378,&local_398);
                pVVar5 = Json::Value::operator[]((Value *)local_158,"Response");
                Json::Value::operator=(pVVar5,&local_378);
                Json::Value::~Value(&local_378);
                std::__cxx11::string::~string((string *)&local_398);
                std::allocator<char>::~allocator((allocator<char> *)&local_399);
              }
              Json::Value::toStyledString_abi_cxx11_(&local_3e8,(Value *)local_158);
              (**connection->_vptr_cmConnection)(connection,&local_3e8);
              std::__cxx11::string::~string((string *)&local_3e8);
              std::__cxx11::string::~string((string *)&v);
            }
          }
        }
      }
      request.field_2._8_4_ = 0;
    }
    else {
      Json::Value::Value(&local_2e0,"Improper command for running context");
      pVVar5 = Json::Value::operator[]((Value *)local_158,"Error");
      Json::Value::operator=(pVVar5,&local_2e0);
      Json::Value::~Value(&local_2e0);
      Json::Value::toStyledString_abi_cxx11_
                ((string *)((long)&requestVal.field_2 + 8),(Value *)local_158);
      (**connection->_vptr_cmConnection)(connection,(undefined1 *)((long)&requestVal.field_2 + 8));
      std::__cxx11::string::~string((string *)(requestVal.field_2._M_local_buf + 8));
      request.field_2._8_4_ = 1;
    }
LAB_0086cfd7:
    cmPauseContext::~cmPauseContext((cmPauseContext *)local_2b8);
    if (request.field_2._8_4_ == 0) goto LAB_0086d00b;
  }
  std::__cxx11::string::~string((string *)local_188);
LAB_0086d021:
  Json::Value::~Value((Value *)local_158);
  Json::Reader::~Reader((Reader *)&value.limit_);
  return;
}

Assistant:

void cmDebugServerJson::ProcessRequest(cmConnection* connection,
                                       const std::string& jsonRequest)
{
  Json::Reader reader;
  Json::Value value;
  if (!reader.parse(jsonRequest, value)) {
    return;
  }

  auto request = value["Command"].asString();

  if (request == "Break") {
    Debugger.Break();
  } else if (request.find("ClearBreakpoints") == 0) {
    Debugger.ClearAllBreakpoints();
  } else if (request.find("RemoveBreakpoint") == 0) {
    Debugger.ClearBreakpoint(value["File"].asString(), value["Line"].asInt());
  } else if (request.find("AddBreakpoint") == 0) {
    Debugger.SetBreakpoint(value["File"].asString(), value["Line"].asInt());
  } else if (request.find("AddWatchpoint") == 0) {
    auto type = value["Type"].asString();
    cmWatchpoint::WatchpointType watchpointType =
      cmWatchpoint::WATCHPOINT_WRITE;
    if (type == "Read") {
      watchpointType = cmWatchpoint::WATCHPOINT_READ;
    } else if (type == "All") {
      watchpointType = cmWatchpoint::WATCHPOINT_ALL;
    }

    Debugger.SetWatchpoint(value["Expr"].asString(), watchpointType);
  } else if (request.find("RemoveWatchpoint") == 0) {
    auto expr = value["Expr"].asString();
    auto watchpoints = Debugger.GetWatchpoints();
    std::vector<watchpoint_id> removeList;
    removeList.reserve(watchpoints.size());
    for (auto& watchpoint : watchpoints) {
      if (watchpoint.Variable == expr) {
        removeList.push_back(watchpoint.Id);
      }
    }

    for (auto& w_id : removeList) {
      Debugger.ClearWatchpoint(w_id);
    }
  } else if (request.find("ClearWatchpoints") == 0) {
    Debugger.ClearAllWatchpoints();
  } else {

    auto ctx = Debugger.PauseContext();
    if (!ctx) {
      value["Error"] = "Improper command for running context";
      connection->WriteData(value.toStyledString());
      return;
    }

    if (request == "Continue") {
      ctx.Continue();
    } else if (request == "StepIn") {
      ctx.StepIn();
    } else if (request == "StepOut") {
      ctx.StepOut();
    } else if (request == "StepOver") {
      ctx.Step();
    } else if (request.find("Evaluate") == 0) {
      auto requestVal = value["Request"].asString();
      const char* v = CM_NULLPTR;
      if (!requestVal.empty() && requestVal[0] == '"' &&
          requestVal.back() == '"') {
        v = ctx.GetMakefile()->ExpandVariablesInString(requestVal);
      } else {
        v = ctx.GetMakefile()->GetDefinition(requestVal);
      }

      value.removeMember("Command");
      if (v) {
        value["Response"] = std::string(v);
      } else {
        value["Response"] = false;
      }
      connection->WriteData(value.toStyledString());
    } else {
      value["Error"] = "Improper command for paused context";
      connection->WriteData(value.toStyledString());
      return;
    }
  }
}